

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_xml_ExpatParser.cpp
# Opt level: O0

bool __thiscall axl::xml::ExpatParserRoot::create(ExpatParserRoot *this,StringRef *encoding)

{
  bool bVar1;
  C *pCVar2;
  XML_ParserStruct *pXVar3;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *in_RSI;
  Handle<XML_ParserStruct_*,_axl::xml::FreeExpatParser,_axl::sl::Zero<XML_ParserStruct_*>_> *in_RDI;
  
  sl::Handle<XML_ParserStruct_*,_axl::xml::FreeExpatParser,_axl::sl::Zero<XML_ParserStruct_*>_>::
  close(in_RDI,(int)in_RSI);
  pCVar2 = sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::szn(in_RSI);
  pXVar3 = (XML_ParserStruct *)XML_ParserCreate(pCVar2);
  in_RDI->m_h = pXVar3;
  bVar1 = err::completeWithSystemError<bool>(this._7_1_,this._6_1_,(uint_t)this);
  return bVar1;
}

Assistant:

bool
ExpatParserRoot::create(const sl::StringRef& encoding) {
	close();

	m_h = XML_ParserCreate(encoding.szn());
	return err::completeWithSystemError(m_h != NULL, false, err::SystemErrorCode_InsufficientResources);
}